

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O3

Token * __thiscall Klex::getToken(Token *__return_storage_ptr__,Klex *this)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  string local_48;
  
  uVar1 = (this->lexeme)._M_string_length;
  uVar2 = this->colNum;
  uVar4 = 0;
  if (uVar1 <= uVar2) {
    uVar4 = uVar1;
  }
  pcVar3 = (this->lexeme)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar3,pcVar3 + uVar1);
  Token::Token(__return_storage_ptr__,&local_48,this->tokenType,this->lineNum,uVar2 - uVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Klex::getToken() {
    unsigned long col = colNum;
    if(lexeme.length() <= colNum)
        col = colNum - lexeme.length();
    return Token(lexeme, tokenType, lineNum, col);
}